

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O3

void __thiscall FIX::SessionState::SessionState(SessionState *this,UtcTimeStamp *now)

{
  _Rb_tree_header *p_Var1;
  int64_t iVar2;
  undefined4 uVar3;
  
  (this->super_MessageStore)._vptr_MessageStore = (_func_int **)&PTR__SessionState_001f6c60;
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__SessionState_001f6d00;
  this->m_enabled = true;
  this->m_receivedLogon = false;
  this->m_sentLogout = false;
  this->m_sentLogon = false;
  this->m_sentReset = false;
  this->m_receivedReset = false;
  this->m_initiate = false;
  this->m_logonTimeout = 10;
  this->m_logoutTimeout = 2;
  this->m_testRequest = 0;
  (this->m_resendRange).first = 0;
  (this->m_resendRange).second = 0;
  IntField::IntField(&(this->m_heartBtInt).super_IntField,0x6c);
  (this->m_heartBtInt).super_IntField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001f6d80;
  (this->m_lastSentTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
  uVar3 = *(undefined4 *)&(now->super_DateTime).field_0xc;
  iVar2 = (now->super_DateTime).m_time;
  (this->m_lastSentTime).super_DateTime.m_date = (now->super_DateTime).m_date;
  *(undefined4 *)&(this->m_lastSentTime).super_DateTime.field_0xc = uVar3;
  (this->m_lastSentTime).super_DateTime.m_time = iVar2;
  (this->m_lastSentTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f59f0;
  (this->m_lastReceivedTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
  uVar3 = *(undefined4 *)&(now->super_DateTime).field_0xc;
  iVar2 = (now->super_DateTime).m_time;
  (this->m_lastReceivedTime).super_DateTime.m_date = (now->super_DateTime).m_date;
  *(undefined4 *)&(this->m_lastReceivedTime).super_DateTime.field_0xc = uVar3;
  (this->m_lastReceivedTime).super_DateTime.m_time = iVar2;
  (this->m_lastReceivedTime).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f59f0;
  (this->m_logoutReason)._M_dataplus._M_p = (pointer)&(this->m_logoutReason).field_2;
  (this->m_logoutReason)._M_string_length = 0;
  (this->m_logoutReason).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_queue)._M_t._M_impl.super__Rb_tree_header;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_pStore = (MessageStore *)0x0;
  this->m_pLog = (Log *)0x0;
  (this->m_nullLog).super_Log._vptr_Log = (_func_int **)&PTR__Log_001f5688;
  (this->m_mutex).m_count = 0;
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

SessionState(const UtcTimeStamp &now)
      : m_enabled(true),
        m_receivedLogon(false),
        m_sentLogout(false),
        m_sentLogon(false),
        m_sentReset(false),
        m_receivedReset(false),
        m_initiate(false),
        m_logonTimeout(10),
        m_logoutTimeout(2),
        m_testRequest(0),
        m_lastSentTime(now),
        m_lastReceivedTime(now),
        m_pStore(0),
        m_pLog(0) {}